

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_failurecount_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::detail::StatementsFailureCount::GetResult
          (AssertionResult *__return_storage_ptr__,StatementsFailureCount *this,size_t cnt,
          char *stetements_str)

{
  long lVar1;
  AssertionResult *pAVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  ulong local_70;
  char *stetements_str_local;
  size_t cnt_local;
  AssertionResult local_58;
  
  lVar1 = ((long)(this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                 super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x30;
  lVar4 = 0;
  uVar3 = 0;
  lVar5 = lVar1;
  stetements_str_local = stetements_str;
  cnt_local = cnt;
  while (bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6) {
    bVar6 = TestPartResult::failed
                      ((TestPartResult *)
                       ((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).
                                 m_results.
                                 super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).
                               m_message._M_dataplus + lVar4));
    uVar3 = uVar3 + bVar6;
    lVar4 = lVar4 + 0x30;
  }
  if (uVar3 < cnt) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_58.m_message._M_dataplus._M_p = (pointer)&local_58.m_message.field_2;
    local_58.m_message._M_string_length = 0;
    local_58.m_message.field_2._M_local_buf[0] = '\0';
    local_58.m_result = false;
    local_70 = uVar3;
    pAVar2 = AssertionResult::operator<<(&local_58,&stetements_str_local);
    pAVar2 = AssertionResult::operator<<
                       (pAVar2,(char (*) [36])"\nExpected: failure count less than ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&cnt_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\n  Actual: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_58);
    AssertionResult::operator<<(__return_storage_ptr__,(char (*) [19])"\nReported results:");
    lVar5 = 0;
    while (bVar6 = lVar1 != 0, lVar1 = lVar1 + -1, bVar6) {
      pAVar2 = AssertionResult::operator<<(__return_storage_ptr__,(char (*) [2])0x133249);
      local_58.m_message._M_dataplus._M_p =
           *(pointer *)
            ((long)&(((this->super_Collector<iutest::detail::NoTestPartResultReporter>).m_results.
                      super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_iuCodeMessage).m_message.
                    _M_dataplus + lVar5);
      AssertionResult::operator<<(pAVar2,(char **)&local_58);
      lVar5 = lVar5 + 0x30;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(size_t cnt, const char* stetements_str)
    {
        const size_t num = count();
        size_t n=0;
        for( size_t i=0; i < num; ++i )
        {
            if( GetTestPartResult(i).failed() )
            {
                ++n;
            }
        }
        if( n < cnt )
        {
            return AssertionSuccess();
        }
        AssertionResult ar = AssertionFailure() << stetements_str << "\nExpected: failure count less than " << cnt << "\n  Actual: " << n;
        ar << "\nReported results:";
        for( size_t i=0; i < num; ++i )
        {
            ar << "\n" << GetTestPartResult(i).message();
        }
        return ar;
    }